

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_ObjPrint(FILE *pFile,Abc_Obj_t *pObj)

{
  Abc_Ntk_t *pAVar1;
  char *__format;
  char *pcVar2;
  long lVar3;
  size_t sStack_30;
  
  fprintf((FILE *)pFile,"Object %5d : ",(ulong)(uint)pObj->Id);
  switch(*(uint *)&pObj->field_0x14 & 0xf) {
  case 0:
    pcVar2 = "NONE   ";
    break;
  case 1:
    pcVar2 = "Const1 ";
    break;
  case 2:
    pcVar2 = "PI     ";
    break;
  case 3:
    pcVar2 = "PO     ";
    break;
  case 4:
    pcVar2 = "BI     ";
    break;
  case 5:
    pcVar2 = "BO     ";
    break;
  case 6:
    pcVar2 = "Net    ";
    break;
  case 7:
    pcVar2 = "Node   ";
    break;
  case 8:
    pcVar2 = "Latch  ";
    break;
  case 9:
    pcVar2 = "Whitebox";
    goto LAB_002aac3d;
  case 10:
    pcVar2 = "Blackbox";
LAB_002aac3d:
    sStack_30 = 8;
    goto LAB_002aac4a;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                  ,0x64b,"void Abc_ObjPrint(FILE *, Abc_Obj_t *)");
  }
  sStack_30 = 7;
LAB_002aac4a:
  fwrite(pcVar2,sStack_30,1,(FILE *)pFile);
  fwrite(" Fanins ( ",10,1,(FILE *)pFile);
  for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
    fprintf((FILE *)pFile,"%d ",
            (ulong)*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]] + 0x10))
    ;
  }
  fwrite(") ",2,1,(FILE *)pFile);
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    pAVar1 = pObj->pNtk;
    if (pAVar1->ntkFunc == ABC_FUNC_MAP) {
      if (pAVar1->ntkType == ABC_NTK_LOGIC) {
        pcVar2 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
        __format = " %s\n";
        goto LAB_002aad0b;
      }
    }
    else if ((pAVar1->ntkFunc == ABC_FUNC_SOP) && (pAVar1->ntkType == ABC_NTK_LOGIC)) {
      pcVar2 = (char *)(pObj->field_5).pData;
      __format = " %s";
LAB_002aad0b:
      fprintf((FILE *)pFile,__format,pcVar2);
      return;
    }
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_ObjPrint( FILE * pFile, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    fprintf( pFile, "Object %5d : ", pObj->Id );
    switch ( pObj->Type )
    {
        case ABC_OBJ_NONE:
            fprintf( pFile, "NONE   " );
            break;
        case ABC_OBJ_CONST1:
            fprintf( pFile, "Const1 " );
            break;
        case ABC_OBJ_PI:
            fprintf( pFile, "PI     " );
            break;
        case ABC_OBJ_PO:
            fprintf( pFile, "PO     " );
            break;
        case ABC_OBJ_BI:
            fprintf( pFile, "BI     " );
            break;
        case ABC_OBJ_BO:
            fprintf( pFile, "BO     " );
            break;
        case ABC_OBJ_NET:
            fprintf( pFile, "Net    " );
            break;
        case ABC_OBJ_NODE:
            fprintf( pFile, "Node   " );
            break;
        case ABC_OBJ_LATCH:
            fprintf( pFile, "Latch  " );
            break;
        case ABC_OBJ_WHITEBOX:
            fprintf( pFile, "Whitebox" );
            break;
        case ABC_OBJ_BLACKBOX:
            fprintf( pFile, "Blackbox" );
            break;
        default:
            assert(0);
            break;
    }
    // print the fanins
    fprintf( pFile, " Fanins ( " );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        fprintf( pFile, "%d ", pFanin->Id );
    fprintf( pFile, ") " );
/*
    fprintf( pFile, " Fanouts ( " );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        fprintf( pFile, "%d(%c) ", pFanin->Id, Abc_NodeIsTravIdCurrent(pFanin)? '+' : '-' );
    fprintf( pFile, ") " );
*/
    // print the logic function
    if ( Abc_ObjIsNode(pObj) && Abc_NtkIsSopLogic(pObj->pNtk) )
        fprintf( pFile, " %s", (char*)pObj->pData );
    else if ( Abc_ObjIsNode(pObj) && Abc_NtkIsMappedLogic(pObj->pNtk) )
        fprintf( pFile, " %s\n", Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
    else
        fprintf( pFile, "\n" );
}